

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

char * llvm::printNode(Node *RootNode,char *Buf,size_t *N)

{
  bool bVar1;
  size_t sVar2;
  undefined1 local_48 [8];
  OutputStream S;
  size_t *N_local;
  char *Buf_local;
  Node *RootNode_local;
  
  S._24_8_ = N;
  OutputStream::OutputStream((OutputStream *)local_48);
  bVar1 = anon_unknown.dwarf_32f1a0::initializeOutputStream
                    (Buf,(size_t *)S._24_8_,(OutputStream *)local_48,0x80);
  if (bVar1) {
    RootNode_local = (Node *)0x0;
  }
  else {
    anon_unknown.dwarf_32f1a0::Node::print(RootNode,(OutputStream *)local_48);
    OutputStream::operator+=((OutputStream *)local_48,'\0');
    if (S._24_8_ != 0) {
      sVar2 = OutputStream::getCurrentPosition((OutputStream *)local_48);
      *(size_t *)S._24_8_ = sVar2;
    }
    RootNode_local = (Node *)OutputStream::getBuffer((OutputStream *)local_48);
  }
  return (char *)RootNode_local;
}

Assistant:

static char *printNode(Node *RootNode, char *Buf, size_t *N) {
  OutputStream S;
  if (initializeOutputStream(Buf, N, S, 128))
    return nullptr;
  RootNode->print(S);
  S += '\0';
  if (N != nullptr)
    *N = S.getCurrentPosition();
  return S.getBuffer();
}